

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O3

filename_t *
spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,size_t index)

{
  pointer pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  filename_t ext;
  filename_t basename;
  char *local_a8;
  size_type sStack_a0;
  char local_98;
  undefined7 uStack_97;
  char *local_88;
  size_type sStack_80;
  char local_78;
  undefined7 uStack_77;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  size_type sStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (index == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  }
  else {
    sStack_80 = 0;
    local_78 = '\0';
    sStack_a0 = 0;
    local_98 = '\0';
    local_a8 = &local_98;
    local_88 = &local_78;
    details::file_helper::split_by_extension
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68,filename);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_48);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    local_68._0_8_ = local_88;
    local_68._8_8_ = sStack_80;
    local_48._M_p = local_a8;
    sStack_40 = sStack_a0;
    fmt.size_ = 0xd4d;
    fmt.data_ = (char *)0x7;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    local_68._16_8_ = index;
    ::fmt::v8::vformat_abi_cxx11_(__return_storage_ptr__,(v8 *)"{}.{}{}",fmt,args);
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::calc_filename(const filename_t &filename, std::size_t index)
{
    if (index == 0u)
    {
        return filename;
    }

    filename_t basename, ext;
    std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
    return fmt_lib::format(SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
}